

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMElementNSImpl.hpp
# Opt level: O3

void __thiscall xercesc_4_0::DOMElementNSImpl::~DOMElementNSImpl(DOMElementNSImpl *this)

{
  DOMElementImpl::~DOMElementImpl((DOMElementImpl *)&this[-1].fLocalName);
  operator_delete(&this[-1].fLocalName,0xb0);
  return;
}

Assistant:

class CDOM_EXPORT DOMElementNSImpl: public DOMElementImpl {
protected:
    //Introduced in DOM Level 2
    const XMLCh * fNamespaceURI;     //namespace URI of this node
    const XMLCh * fLocalName;        //local part of qualified name
    const XMLCh * fPrefix;
    const DOMTypeInfoImpl *fSchemaType;

public:
    DOMElementNSImpl(DOMDocument *ownerDoc, const XMLCh *name);
    DOMElementNSImpl(DOMDocument *ownerDoc, //DOM Level 2
                     const XMLCh *namespaceURI,
                     const XMLCh *qualifiedName);
    DOMElementNSImpl(const DOMElementNSImpl &other, bool deep=false);

    // Fast construction without any checks for name validity. Used in
    // parsing.
    //
    DOMElementNSImpl(DOMDocument *ownerDoc,
                     const XMLCh *namespaceURI,
                     const XMLCh *prefix,        // Null or empty - no prefix.
                     const XMLCh *localName,
                     const XMLCh *qualifiedName);

    virtual DOMNode * cloneNode(bool deep) const;
    virtual bool isSupported(const XMLCh *feature, const XMLCh *version) const;
    virtual void* getFeature(const XMLCh* feature, const XMLCh* version) const;

    //Introduced in DOM Level 2
    virtual const XMLCh *getNamespaceURI() const;
    virtual const XMLCh *getPrefix() const;
    virtual const XMLCh *getLocalName() const;
    virtual void         setPrefix(const XMLCh *prefix);
    virtual void         release();

    //Introduced in DOM Level 3
    virtual const DOMTypeInfo * getSchemaTypeInfo() const;

   // helper function for DOM Level 3 renameNode
   virtual DOMNode* rename(const XMLCh* namespaceURI, const XMLCh* name);
   void setName(const XMLCh* namespaceURI, const XMLCh* name);

    //helper function for DOM Level 3 TypeInfo
    virtual void setSchemaTypeInfo(const DOMTypeInfoImpl* typeInfo);

private:
    // -----------------------------------------------------------------------
    // Unimplemented constructors and operators
    // -----------------------------------------------------------------------
    DOMElementNSImpl & operator = (const DOMElementNSImpl &);
}